

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O2

void __thiscall
CLIntercept::dumpProgramSource
          (CLIntercept *this,cl_program program,uint64_t hash,bool modified,char *singleString)

{
  uint uVar1;
  size_t size;
  mapped_type *pmVar2;
  double __x;
  string fileName;
  char numberString [256];
  string local_180;
  cl_program local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  string local_138 [8];
  
  local_160 = program;
  std::mutex::lock(&this->m_Mutex);
  local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
  local_180._M_string_length = 0;
  local_180.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)local_138,sc_DumpDirectoryName,(allocator *)&local_158);
  OS::Services_Common::GetDumpDirectoryName
            (&(this->m_OS).super_Services_Common,local_138,&local_180);
  std::__cxx11::string::~string((string *)local_138);
  if (modified) {
    std::__cxx11::string::append((char *)&local_180);
  }
  memset(local_138,0,0x100);
  if ((this->m_Config).OmitProgramNumber == true) {
    snprintf((char *)local_138,0x100,"%08X",hash & 0xffffffff);
  }
  else {
    snprintf((char *)local_138,0x100,"%04u_%08X",(ulong)this->m_ProgramNumber,hash & 0xffffffff);
  }
  std::__cxx11::string::append((char *)&local_180);
  std::__cxx11::string::append((char *)&local_180);
  std::__cxx11::string::append((char *)&local_180);
  OS::Services_Common::MakeDumpDirectories(&(this->m_OS).super_Services_Common,&local_180);
  if (singleString != (char *)0x0) {
    std::operator+(&local_158,"Dumping program to file (inject): ",&local_180);
    std::operator+(local_138,&local_158,"\n");
    log(this,__x);
    std::__cxx11::string::~string((string *)local_138);
    std::__cxx11::string::~string((string *)&local_158);
    size = strlen(singleString);
    dumpMemoryToFile(this,&local_180,false,singleString,size);
  }
  pmVar2 = std::
           map<_cl_program_*,_CLIntercept::SProgramInfo,_std::less<_cl_program_*>,_std::allocator<std::pair<_cl_program_*const,_CLIntercept::SProgramInfo>_>_>
           ::operator[](&this->m_ProgramInfoMap,&local_160);
  uVar1 = this->m_ProgramNumber;
  pmVar2->ProgramNumber = uVar1;
  pmVar2->CompileCount = 0;
  this->m_ProgramNumber = uVar1 + 1;
  std::__cxx11::string::~string((string *)&local_180);
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_Mutex);
  return;
}

Assistant:

void CLIntercept::dumpProgramSource(
    cl_program program,
    uint64_t hash,
    bool modified,
    const char* singleString )
{
    std::lock_guard<std::mutex> lock(m_Mutex);

    CLI_ASSERT( config().DumpProgramSource || config().AutoCreateSPIRV );

    std::string fileName;

    // Get the dump directory name.
    {
        OS().GetDumpDirectoryName( sc_DumpDirectoryName, fileName );
    }
    if( modified )
    {
        fileName += "/Modified";
    }

    // Make the file name.  It will have the form:
    //   CLI_<program number>_<hash>_source.cl
    {
        char    numberString[256] = "";

        if( config().OmitProgramNumber )
        {
            CLI_SPRINTF( numberString, 256, "%08X",
                (unsigned int)hash );
        }
        else
        {
            CLI_SPRINTF( numberString, 256, "%04u_%08X",
                m_ProgramNumber,
                (unsigned int)hash );
        }

        fileName += "/CLI_";
        fileName += numberString;
        fileName += "_source.cl";
    }
    // Now make directories as appropriate.
    {
        OS().MakeDumpDirectories( fileName );
    }
    // Dump the program source to a .cl file.
    if( singleString )
    {
        log( "Dumping program to file (inject): " + fileName + "\n" );
        dumpMemoryToFile(
            fileName,
            false,
            singleString,
            strlen(singleString) );
    }

    SProgramInfo&   programInfo = m_ProgramInfoMap[ program ];
    programInfo.ProgramNumber = m_ProgramNumber;
    programInfo.CompileCount = 0;

    m_ProgramNumber++;
}